

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvar.cc
# Opt level: O1

void __thiscall
tchecker::system::intvars_t::add_intvar
          (intvars_t *this,string *name,intvar_id_t size,integer_t min,integer_t max,
          integer_t initial,attributes_t *attributes)

{
  stored_size_type sVar1;
  
  integer_variables_t::declare(&this->_integer_variables,name,size,min,max,initial);
  if (size != 0) {
    do {
      std::vector<tchecker::system::attributes_t,std::allocator<tchecker::system::attributes_t>>::
      emplace_back<tchecker::system::attributes_t_const&>
                ((vector<tchecker::system::attributes_t,std::allocator<tchecker::system::attributes_t>>
                  *)&this->_integer_variables_attributes,attributes);
      size = size - 1;
    } while (size != 0);
  }
  sVar1 = *(stored_size_type *)
           ((long)&(this->_integer_variables).
                   super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._flattened_variables.
                   super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map + 8);
  if (sVar1 == *(stored_size_type *)
                ((long)&(this->_integer_variables).
                        super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._flattened_variables.
                        super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map + 8)) {
    if (sVar1 == ((long)(this->_integer_variables_attributes).
                        super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_integer_variables_attributes).
                        super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
      return;
    }
    __assert_fail("_integer_variables.size(tchecker::VK_FLATTENED) == _integer_variables_attributes.size()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/intvar.cc"
                  ,0x19,
                  "void tchecker::system::intvars_t::add_intvar(const std::string &, tchecker::intvar_id_t, tchecker::integer_t, tchecker::integer_t, tchecker::integer_t, const tchecker::system::attributes_t &)"
                 );
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x90,
                "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

void intvars_t::add_intvar(std::string const & name, tchecker::intvar_id_t size, tchecker::integer_t min,
                           tchecker::integer_t max, tchecker::integer_t initial,
                           tchecker::system::attributes_t const & attributes)
{
  _integer_variables.declare(name, size, min, max, initial);
  for (tchecker::intvar_id_t i = 0; i < size; ++i)
    _integer_variables_attributes.emplace_back(attributes);
  assert(_integer_variables.size(tchecker::VK_FLATTENED) == _integer_variables_attributes.size());
}